

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall
spdlog::logger::log<unsigned_char>
          (logger *this,source_loc source,level_enum lvl,char *fmt,uchar *args)

{
  level_enum lvl_00;
  logger *plVar1;
  uint32_t uVar2;
  bool bVar3;
  string_view_t view;
  source_loc loc;
  exception *ex;
  undefined1 local_2c8 [8];
  log_msg log_msg;
  allocator<char> local_251;
  undefined1 local_250 [8];
  memory_buffer buf;
  uchar *args_local;
  char *fmt_local;
  logger *plStack_20;
  level_enum lvl_local;
  logger *this_local;
  source_loc source_local;
  
  this_local = (logger *)source.filename;
  source_local.filename._0_4_ = source.line;
  buf._528_8_ = args;
  args_local = (uchar *)fmt;
  fmt_local._4_4_ = lvl;
  plStack_20 = this;
  bVar3 = should_log(this,lvl);
  if (bVar3) {
    std::allocator<char>::allocator();
    ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250,&local_251);
    std::allocator<char>::~allocator(&local_251);
    log_msg.payload._M_str =
         (char *)::fmt::v5::format_to<char_const*,unsigned_char,500ul,char>
                           ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250,
                            (char **)&args_local,(uchar *)buf._528_8_);
    uVar2 = (uint32_t)source_local.filename;
    plVar1 = this_local;
    lvl_00 = fmt_local._4_4_;
    view = details::fmt_helper::to_string_view<500ul>
                     ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250);
    loc.line = uVar2;
    loc.filename = (char *)plVar1;
    loc._12_4_ = 0;
    details::log_msg::log_msg((log_msg *)local_2c8,loc,&this->name_,lvl_00,view);
    (*this->_vptr_logger[3])(this,local_2c8);
    ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250);
  }
  return;
}

Assistant:

inline void spdlog::logger::log(source_loc source, level::level_enum lvl, const char *fmt, const Args &... args)
{
    if (!should_log(lvl))
    {
        return;
    }

    try
    {
        using details::fmt_helper::to_string_view;
        fmt::memory_buffer buf;
        fmt::format_to(buf, fmt, args...);
        details::log_msg log_msg(source, &name_, lvl, to_string_view(buf));
        sink_it_(log_msg);
    }
    SPDLOG_CATCH_AND_HANDLE
}